

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtPubkeyList
              (void *handle,void *psbt_handle,int kind,uint32_t index,uint32_t *list_num,
              void **pubkey_list_handle)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  iterator iVar3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this_00;
  pointer this_01;
  size_type sVar4;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  undefined4 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  Pubkey *pubkey;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range3;
  string empty_path;
  ByteData empty_fingerprint;
  bool has_xpub_list;
  bool has_bip32_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pk_list;
  CfdCapiPsbtHandle *psbt_obj;
  CfdCapiPsbtPubkeyListHandle *buffer;
  int result;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *in_stack_fffffffffffffcd8;
  ByteData *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  Pubkey *in_stack_fffffffffffffcf8;
  CfdError CVar6;
  allocator *paVar5;
  CfdException *in_stack_fffffffffffffd00;
  allocator local_291;
  string local_290 [8];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_fffffffffffffd78;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_fffffffffffffd80;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  in_stack_fffffffffffffd98;
  uint32_t size;
  iterator in_stack_fffffffffffffda0;
  string local_250 [32];
  ByteData local_230;
  undefined6 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdee;
  allocator in_stack_fffffffffffffdef;
  void *in_stack_fffffffffffffdf0;
  CfdSourceLocation local_1f0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1d8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1c0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1a8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_190;
  byte local_172;
  byte local_171;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_170;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_158;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [48];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  undefined4 *local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  size = (uint32_t)((ulong)in_stack_fffffffffffffd98._M_current >> 0x20);
  local_34 = 0xffffffff;
  local_40 = (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer
            (in_stack_fffffffffffffdf0,
             (string *)
             CONCAT17(in_stack_fffffffffffffdef,
                      CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  if (local_30 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x6d4;
    local_98.funcname = "CfdGetPsbtPubkeyList";
    cfd::core::logger::warn<>(&local_98,"pubkey_list_handle is null.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Failed to parameter. pubkey_list_handle is null.",&local_b9);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffffd00,CVar6,in_stack_fffffffffffffcf0)
    ;
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 != (undefined4 *)0x0) {
    if (*(long *)(local_18 + 0x18) != 0) {
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)0x5f9b12);
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(&local_170);
      local_171 = 1;
      local_172 = 0;
      switch(local_1c) {
      case 1:
        cfd::core::Psbt::GetTxInSignaturePubkeyList(&local_190,*(Psbt **)(local_80 + 0x18),local_20)
        ;
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator=
                  (&local_158,&local_190);
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   in_stack_fffffffffffffcf0);
        break;
      case 2:
        cfd::core::Psbt::GetTxInKeyDataList(&local_1a8,*(Psbt **)(local_80 + 0x18),local_20);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffcf0,
                   (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffce8);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffcf0);
        break;
      case 3:
        cfd::core::Psbt::GetTxOutKeyDataList(&local_1c0,*(Psbt **)(local_80 + 0x18),local_20);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffcf0,
                   (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffce8);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffcf0);
        break;
      case 4:
        cfd::core::Psbt::GetGlobalXpubkeyDataList(&local_1d8,*(Psbt **)(local_80 + 0x18));
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffcf0,
                   (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffce8);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffffcf0);
        local_172 = 1;
        break;
      default:
        local_1f0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                     ,0x2f);
        CVar6 = (CfdError)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        local_1f0.filename = local_1f0.filename + 1;
        local_1f0.line = 0x6f9;
        local_1f0.funcname = "CfdGetPsbtPubkeyList";
        cfd::core::logger::warn<int&>(&local_1f0,"kind is invalid: {}",&local_1c);
        this = (CfdException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffdf0,"Failed to parameter. kind is invalid.",
                   (allocator *)&stack0xfffffffffffffdef);
        cfd::core::CfdException::CfdException(this,CVar6,in_stack_fffffffffffffcf0);
        __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
      }
      bVar1 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                        (&local_170);
      if (bVar1) {
        local_171 = 0;
        cfd::core::ByteData::ByteData(&local_230);
        std::__cxx11::string::string(local_250);
        sVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size(&local_158)
        ;
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
                  (&local_170,sVar4);
        in_stack_fffffffffffffda0 =
             std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                       (in_stack_fffffffffffffcd8);
        iVar3 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                          (in_stack_fffffffffffffcd8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                                   *)&stack0xfffffffffffffda0,
                                  (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                                   *)&stack0xfffffffffffffd98),
              size = (uint32_t)((ulong)iVar3._M_current >> 0x20), bVar1) {
          __gnu_cxx::
          __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
          ::operator*((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                       *)&stack0xfffffffffffffda0);
          std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
          emplace_back<cfd::core::Pubkey_const&,std::__cxx11::string&,cfd::core::ByteData&>
                    ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                     in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     in_stack_fffffffffffffce8);
          __gnu_cxx::
          __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
          ::operator++((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                        *)&stack0xfffffffffffffda0);
        }
        std::__cxx11::string::~string(local_250);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f9f1b);
      }
      paVar5 = &local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,"PsbtPubkeyList",paVar5);
      this_00 = (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                cfd::capi::AllocBuffer((string *)in_stack_fffffffffffffda0._M_current,size);
      local_40 = this_00;
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      this_01 = (pointer)operator_new(0x18);
      (((_Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&this_01->pubkey_)
      ->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&this_01->pubkey_)
      ->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&this_01->pubkey_)
      ->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this_01);
      local_40[1].super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
      _M_impl.super__Vector_impl_data._M_start = this_01;
      *(byte *)&(local_40->
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage = local_171 & 1;
      *(byte *)((long)&(local_40->
                       super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = local_172 & 1;
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      sVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size(&local_170)
      ;
      *local_28 = (int)sVar4;
      *local_30 = local_40;
      local_4 = 0;
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(this_00);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)this_00);
      return local_4;
    }
    local_118.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    local_118.filename = local_118.filename + 1;
    local_118.line = 0x6e0;
    local_118.funcname = "CfdGetPsbtPubkeyList";
    cfd::core::logger::warn<>(&local_118,"psbt is null.");
    local_13a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Failed to handle statement. psbt is null.",&local_139);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffffd00,CVar6,in_stack_fffffffffffffcf0)
    ;
    local_13a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  CVar6 = (CfdError)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  local_d8.filename = local_d8.filename + 1;
  local_d8.line = 0x6da;
  local_d8.funcname = "CfdGetPsbtPubkeyList";
  cfd::core::logger::warn<>(&local_d8,"list_num is null.");
  local_fa = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Failed to parameter. list_num is null.",&local_f9);
  cfd::core::CfdException::CfdException(in_stack_fffffffffffffd00,CVar6,in_stack_fffffffffffffcf0);
  local_fa = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtPubkeyList(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    uint32_t* list_num, void** pubkey_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtPubkeyListHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey_list_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey_list_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey_list_handle is null.");
    }
    if (list_num == nullptr) {
      warn(CFD_LOG_SOURCE, "list_num is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. list_num is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::vector<Pubkey> pk_list;
    std::vector<KeyData> key_list;
    bool has_bip32_list = true;
    bool has_xpub_list = false;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        pk_list = psbt_obj->psbt->GetTxInSignaturePubkeyList(index);
        break;
      case kCfdPsbtRecordInputBip32:
        key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
        break;
      case kCfdPsbtRecordOutputBip32:
        key_list = psbt_obj->psbt->GetTxOutKeyDataList(index);
        break;
      case kCfdPsbtRecordGloalXpub:
        key_list = psbt_obj->psbt->GetGlobalXpubkeyDataList();
        has_xpub_list = true;
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }
    if (key_list.empty()) {
      has_bip32_list = false;
      ByteData empty_fingerprint;
      std::string empty_path;
      key_list.reserve(pk_list.size());
      for (const auto& pubkey : pk_list) {
        key_list.emplace_back(pubkey, empty_path, empty_fingerprint);
      }
    }

    buffer = static_cast<CfdCapiPsbtPubkeyListHandle*>(AllocBuffer(
        kPrefixPsbtPubkeyList, sizeof(CfdCapiPsbtPubkeyListHandle)));
    buffer->key_list = new std::vector<KeyData>();
    buffer->has_bip32_list = has_bip32_list;
    buffer->has_xpub_list = has_xpub_list;
    *(buffer->key_list) = key_list;
    *list_num = static_cast<uint32_t>(key_list.size());
    *pubkey_list_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtPubkeyList(handle, buffer);
  return result;
}